

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  Rep *pRVar2;
  Model *this_00;
  LogMessage *other;
  long lVar3;
  LogFinisher local_69;
  LogMessage local_68;
  
  iVar1 = this->current_size_;
  if ((long)iVar1 < 0) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x60a);
    other = LogMessage::operator<<(&local_68,"CHECK failed: (n) >= (0): ");
    LogFinisher::operator=(&local_69,other);
    LogMessage::~LogMessage(&local_68);
  }
  if (0 < iVar1) {
    pRVar2 = this->rep_;
    lVar3 = 0;
    do {
      this_00 = (Model *)pRVar2->elements[lVar3];
      if (this_00->description_ != (ModelDescription *)0x0) {
        (*(this_00->description_->super_MessageLite)._vptr_MessageLite[1])();
      }
      lVar3 = lVar3 + 1;
      *(undefined8 *)((long)&this_00->description_ + 5) = 0;
      this_00->description_ = (ModelDescription *)0x0;
      CoreML::Specification::Model::clear_Type(this_00);
    } while (iVar1 != lVar3);
    this->current_size_ = 0;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Clear() {
  const int n = current_size_;
  GOOGLE_DCHECK_GE(n, 0);
  if (n > 0) {
    void* const* elements = rep_->elements;
    int i = 0;
    do {
      TypeHandler::Clear(cast<TypeHandler>(elements[i++]));
    } while (i < n);
    current_size_ = 0;
  }
}